

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.c
# Opt level: O2

void test_len(void)

{
  uint32_t *puVar1;
  uint __line;
  char cVar2;
  int iVar3;
  char *__assertion;
  long lVar4;
  undefined1 local_50 [8];
  queue_t queue;
  qdata_t qdata;
  
  fwrite("test_len() started\n",0x13,1,_stderr);
  cVar2 = queue_init(local_50);
  if (cVar2 == '\0') {
    __assertion = "queue_init(&queue)";
    __line = 0x4a;
  }
  else {
    lVar4 = 0;
    do {
      if (lVar4 == 4000000) {
        iVar3 = queue_len(local_50);
        if (iVar3 == 1000000) {
          lVar4 = 0;
          goto LAB_001014c9;
        }
        __assertion = "LEN == queue_len(&queue)";
        __line = 0x51;
        goto LAB_00101559;
      }
      queue.len = *(uint32_t *)((long)data + lVar4);
      cVar2 = queue_enqueue(local_50,CONCAT44(queue._20_4_,queue.len));
      lVar4 = lVar4 + 4;
    } while (cVar2 != '\0');
    __assertion = "queue_enqueue(&queue, qdata)";
    __line = 0x4e;
  }
  goto LAB_00101559;
  while( true ) {
    cVar2 = queue_dequeue(local_50,&queue.len);
    if (cVar2 == '\0') {
      __assertion = "queue_dequeue(&queue, &qdata)";
      __line = 0x54;
      goto LAB_00101559;
    }
    puVar1 = (uint32_t *)((long)data + lVar4);
    lVar4 = lVar4 + 4;
    if (*puVar1 != queue.len) break;
LAB_001014c9:
    if (lVar4 == 4000000) {
      iVar3 = queue_len(local_50);
      if (iVar3 == 0) {
        queue_clear(local_50);
        fwrite("test_len() succeed\n",0x13,1,_stderr);
        return;
      }
      __assertion = "0 == queue_len(&queue)";
      __line = 0x58;
      goto LAB_00101559;
    }
  }
  __assertion = "data[i] == qdata.i32";
  __line = 0x55;
LAB_00101559:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                ,__line,"void test_len()");
}

Assistant:

void test_len()
{
    int i;
    qdata_t qdata;
    queue_t queue;

    fprintf(stderr, "test_len() started\n");

    assert(queue_init(&queue));

    for (i = 0; i < LEN; ++i) {
        qdata.i32 = data[i];
        assert(queue_enqueue(&queue, qdata));
    }

    assert(LEN == queue_len(&queue));

    for (i = 0; i < LEN; ++i) {
        assert(queue_dequeue(&queue, &qdata));
        assert(data[i] == qdata.i32);
    }

    assert(0 == queue_len(&queue));

    queue_clear(&queue);

    fprintf(stderr, "test_len() succeed\n");
}